

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O0

Error __thiscall
asmjit::_abi_1_10::a64::RACFGBuilder::moveImmToRegArg
          (RACFGBuilder *this,InvokeNode *invokeNode,FuncValue *arg,Imm *imm_,BaseReg *out)

{
  bool bVar1;
  TypeId TVar2;
  Error EVar3;
  EmitterExplicitT<asmjit::_abi_1_10::a64::Compiler> *this_00;
  VirtReg *this_01;
  Imm *in_RCX;
  FuncValue *in_RDX;
  RACFGBuilder *in_RDI;
  Operand_ *in_R8;
  Error _err;
  TypeId typeId;
  Imm imm;
  char *in_stack_00000380;
  int in_stack_0000038c;
  char *in_stack_00000390;
  Gp *in_stack_ffffffffffffff88;
  Imm *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  uint32_t id;
  undefined4 in_stack_ffffffffffffffa0;
  BaseReg *in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc8 [2];
  InvokeNode *local_18 [2];
  Error local_4;
  
  id = (uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  DebugUtils::unused<asmjit::_abi_1_10::InvokeNode*&>(local_18);
  bVar1 = FuncValue::isReg((FuncValue *)0x1719fb);
  if (bVar1) {
    Imm::Imm((Imm *)&stack0xffffffffffffffc0,in_RCX);
    TVar2 = FuncValue::typeId(in_RDX);
    switch(TVar2) {
    case kInt8:
      TVar2 = _kIntEnd;
      Imm::signExtend8Bits(in_stack_ffffffffffffff90);
      break;
    case kUInt8:
      TVar2 = _kIntEnd;
      Imm::zeroExtend8Bits(in_stack_ffffffffffffff90);
      break;
    case kInt16:
      TVar2 = _kIntEnd;
      Imm::signExtend16Bits(in_stack_ffffffffffffff90);
      break;
    case kUInt16:
      TVar2 = _kIntEnd;
      Imm::zeroExtend16Bits(in_stack_ffffffffffffff90);
      break;
    case kInt32:
      TVar2 = _kIntEnd;
      Imm::signExtend32Bits(in_stack_ffffffffffffff90);
      break;
    case kUInt32:
      TVar2 = _kIntEnd;
      Imm::zeroExtend32Bits((Imm *)&stack0xffffffffffffffc0);
      break;
    case kInt64:
      TVar2 = _kIntEnd;
      break;
    case _kIntEnd:
      TVar2 = _kIntEnd;
      break;
    default:
      EVar3 = DebugUtils::errored(0x19);
      return EVar3;
    }
    cc(in_RDI);
    local_4 = BaseCompiler::_newReg
                        ((BaseCompiler *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,TVar2,
                         (char *)in_RDI);
    if (local_4 == 0) {
      this_00 = (EmitterExplicitT<asmjit::_abi_1_10::a64::Compiler> *)cc(in_RDI);
      Operand_::id(in_R8);
      this_01 = BaseCompiler::virtRegById
                          ((BaseCompiler *)CONCAT44(local_4,in_stack_ffffffffffffffa0),id);
      VirtReg::setWeight(this_01,0x50);
      cc(in_RDI);
      Operand_::as<asmjit::_abi_1_10::arm::Gp>(in_R8);
      local_4 = EmitterExplicitT<asmjit::_abi_1_10::a64::Compiler>::mov
                          (this_00,in_stack_ffffffffffffff88,(Imm *)0x171b98);
    }
    return local_4;
  }
  DebugUtils::assertionFailed(in_stack_00000390,in_stack_0000038c,in_stack_00000380);
}

Assistant:

Error RACFGBuilder::moveImmToRegArg(InvokeNode* invokeNode, const FuncValue& arg, const Imm& imm_, BaseReg* out) noexcept {
  DebugUtils::unused(invokeNode);
  ASMJIT_ASSERT(arg.isReg());

  Imm imm(imm_);
  TypeId typeId = TypeId::kVoid;

  switch (arg.typeId()) {
    case TypeId::kInt8  : typeId = TypeId::kUInt64; imm.signExtend8Bits(); break;
    case TypeId::kUInt8 : typeId = TypeId::kUInt64; imm.zeroExtend8Bits(); break;
    case TypeId::kInt16 : typeId = TypeId::kUInt64; imm.signExtend16Bits(); break;
    case TypeId::kUInt16: typeId = TypeId::kUInt64; imm.zeroExtend16Bits(); break;
    case TypeId::kInt32 : typeId = TypeId::kUInt64; imm.signExtend32Bits(); break;
    case TypeId::kUInt32: typeId = TypeId::kUInt64; imm.zeroExtend32Bits(); break;
    case TypeId::kInt64 : typeId = TypeId::kUInt64; break;
    case TypeId::kUInt64: typeId = TypeId::kUInt64; break;

    default:
      return DebugUtils::errored(kErrorInvalidAssignment);
  }

  ASMJIT_PROPAGATE(cc()->_newReg(out, typeId, nullptr));
  cc()->virtRegById(out->id())->setWeight(BaseRAPass::kCallArgWeight);
  return cc()->mov(out->as<Gp>(), imm);
}